

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall ADS::Graph<unsigned_int>::empty(Graph<unsigned_int> *this)

{
  int iVar1;
  undefined4 extraout_var;
  Edge<unsigned_int> *pEVar3;
  uint i;
  uint uVar4;
  void *pvVar2;
  
  for (uVar4 = 0; uVar4 < (this->_vertices)._uiLen; uVar4 = uVar4 + 1) {
    iVar1 = DArray<ADS::Vertex<unsigned_int>_*>::remove(&this->_vertices,(char *)(ulong)uVar4);
    pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
    if (pvVar2 != (void *)0x0) {
      while( true ) {
        pEVar3 = LChain<ADS::Edge<unsigned_int>_*,_ADS::ObjPointerComparator<ADS::Edge<unsigned_int>_>_>
                 ::pop((LChain<ADS::Edge<unsigned_int>_*,_ADS::ObjPointerComparator<ADS::Edge<unsigned_int>_>_>
                        *)((long)pvVar2 + 8));
        if (pEVar3 == (Edge<unsigned_int> *)0x0) break;
        operator_delete(pEVar3);
      }
    }
    operator_delete(pvVar2);
  }
  this->_uiNVertexes = 0;
  this->_uiNEdges = 0;
  return;
}

Assistant:

void Graph<T>::empty()
    {
        for (unsigned int i = 0; i < _vertices.size(); i++) {
            Vertex<T> *pVertex = _vertices.remove (i);
            if (pVertex != NULL) {
                for (Edge<T> *pEdge = pVertex->edges.pop(); pEdge != NULL;
                     pEdge = pVertex->edges.pop())
                    delete pEdge;
            }
            delete pVertex;
        }
        _uiNVertexes = 0;
        _uiNEdges = 0;
    }